

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_engine.hpp
# Opt level: O3

AST_NodePtr __thiscall chaiscript::ChaiScript::parse(ChaiScript *this,string *t_input)

{
  bool bVar1;
  eval_error *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  AST_NodePtr AVar2;
  ChaiScript_Parser parser;
  string local_d38;
  string local_d18;
  ChaiScript_Parser local_cf8;
  
  chaiscript::parser::ChaiScript_Parser::ChaiScript_Parser(&local_cf8);
  local_d38._M_dataplus._M_p = (pointer)&local_d38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d38,"PARSE","");
  bVar1 = chaiscript::parser::ChaiScript_Parser::parse(&local_cf8,t_input,&local_d38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d38._M_dataplus._M_p != &local_d38.field_2) {
    operator_delete(local_d38._M_dataplus._M_p,local_d38.field_2._M_allocated_capacity + 1);
  }
  if (bVar1) {
    chaiscript::parser::ChaiScript_Parser::optimized_ast
              ((ChaiScript_Parser *)this,SUB81(&local_cf8,0),false);
    chaiscript::parser::ChaiScript_Parser::~ChaiScript_Parser(&local_cf8);
    AVar2.super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    AVar2.super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (AST_NodePtr)AVar2.super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (eval_error *)__cxa_allocate_exception(0x90);
  local_d18._M_dataplus._M_p = (pointer)&local_d18.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d18,"Unknown error while parsing","");
  exception::eval_error::eval_error(this_00,&local_d18);
  __cxa_throw(this_00,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
}

Assistant:

static AST_NodePtr parse(const std::string &t_input)
    {
      parser::ChaiScript_Parser parser;
      if (parser.parse(t_input, "PARSE")) {
        //parser.show_match_stack();
        return parser.optimized_ast();
      } else {
        throw chaiscript::exception::eval_error("Unknown error while parsing");
      }
    }